

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

string * __thiscall
pugi::impl::(anonymous_namespace)::as_utf8_impl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,wchar_t *str,size_t length)

{
  size_t sVar1;
  
  sVar1 = anon_unknown_0::as_utf8_begin((wchar_t *)this,(size_t)str);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  if (sVar1 != 0) {
    anon_unknown_0::utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
    process<pugi::impl::(anonymous_namespace)::utf8_writer>
              (this,str,(__return_storage_ptr__->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN std::string as_utf8_impl(const wchar_t* str, size_t length)
	{
		// first pass: get length in utf8 characters
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		std::string result;
		result.resize(size);

		// second pass: convert to utf8
		if (size > 0) as_utf8_end(&result[0], size, str, length);

		return result;
	}